

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harness.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  UnitTest *pUVar5;
  TestEventListeners *this;
  TestEventListener *pTVar6;
  TestEventListener *listener;
  char **ppcVar7;
  char **ppcVar8;
  int local_2c;
  
  local_2c = argc;
  testing::InitGoogleMock(&local_2c,argv);
  lVar4 = (long)local_2c;
  if (1 < lVar4) {
    ppcVar8 = argv + 1;
    ppcVar1 = argv + lVar4;
    uVar2 = lVar4 * 8 - 8;
    lVar4 = (long)uVar2 >> 5;
    if (0 < lVar4) {
      ppcVar8 = (char **)((long)ppcVar8 + (uVar2 & 0xffffffffffffffe0));
      lVar4 = lVar4 + 1;
      ppcVar7 = argv + 4;
      do {
        iVar3 = strcmp(ppcVar7[-3],"--loud");
        if (iVar3 == 0) {
          ppcVar7 = ppcVar7 + -3;
          goto LAB_0018e81b;
        }
        iVar3 = strcmp(ppcVar7[-2],"--loud");
        if (iVar3 == 0) {
          ppcVar7 = ppcVar7 + -2;
          goto LAB_0018e81b;
        }
        iVar3 = strcmp(ppcVar7[-1],"--loud");
        if (iVar3 == 0) {
          ppcVar7 = ppcVar7 + -1;
          goto LAB_0018e81b;
        }
        iVar3 = strcmp(*ppcVar7,"--loud");
        if (iVar3 == 0) goto LAB_0018e81b;
        lVar4 = lVar4 + -1;
        ppcVar7 = ppcVar7 + 4;
      } while (1 < lVar4);
    }
    lVar4 = (long)ppcVar1 - (long)ppcVar8 >> 3;
    if (lVar4 == 1) {
LAB_0018e7ea:
      iVar3 = strcmp(*ppcVar8,"--loud");
      ppcVar7 = ppcVar8;
      if (iVar3 != 0) {
        ppcVar7 = ppcVar1;
      }
    }
    else {
      ppcVar7 = ppcVar8;
      if (lVar4 == 2) {
LAB_0018e7d2:
        iVar3 = strcmp(*ppcVar7,"--loud");
        if (iVar3 != 0) {
          ppcVar8 = ppcVar7 + 1;
          goto LAB_0018e7ea;
        }
      }
      else {
        ppcVar7 = ppcVar1;
        if ((lVar4 == 3) && (iVar3 = strcmp(*ppcVar8,"--loud"), ppcVar7 = ppcVar8, iVar3 != 0)) {
          ppcVar7 = ppcVar8 + 1;
          goto LAB_0018e7d2;
        }
      }
    }
LAB_0018e81b:
    if (ppcVar7 != ppcVar1) goto LAB_0018e862;
  }
  pUVar5 = testing::UnitTest::GetInstance();
  this = testing::UnitTest::listeners(pUVar5);
  pTVar6 = testing::TestEventListeners::Release(this,this->default_result_printer_);
  listener = (TestEventListener *)operator_new(0x10);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__quiet_event_listener_00242248;
  listener[1]._vptr_TestEventListener = (_func_int **)pTVar6;
  testing::TestEventListeners::Append(this,listener);
LAB_0018e862:
  pUVar5 = testing::UnitTest::GetInstance();
  iVar3 = testing::UnitTest::Run(pUVar5);
  return iVar3;
}

Assistant:

int main (int argc, char ** argv) {
    PSTORE_TRY {
#if PSTORE_IS_INSIDE_LLVM
        llvm::sys::PrintStackTraceOnErrorSignal (argv[0], true /* Disable crash reporting */);
#endif

        // Since Google Mock depends on Google Test, InitGoogleMock() is
        // also responsible for initializing Google Test. Therefore there's
        // no need for calling testing::InitGoogleTest() separately.
        testing::InitGoogleMock (&argc, argv);

        // Unless the user enables "loud mode" by passing the appropriate switch, we silence much of
        // google test/mock's output so that we only see detailed information about tests that fail.
        if (!loud_mode_enabled (argc, argv)) {
            // Remove the default listener
            testing::TestEventListeners & listeners =
                testing::UnitTest::GetInstance ()->listeners ();
            testing::TestEventListener * const default_printer =
                listeners.Release (listeners.default_result_printer ());

            // Add our listener. By default everything is on (as when using the default listener)
            // but here we turn everything off so we only see the 3 lines for the result (plus any
            // failures at the end), like:
            //
            // [==========] Running 149 tests from 53 test cases.
            // [==========] 149 tests from 53 test cases ran. (1 ms total)
            // [  PASSED  ] 149 tests.

            listeners.Append (new quiet_event_listener (default_printer));
        }

#if defined(_WIN32)
        // Disable all of the possible ways Windows conspires to make automated
        // testing impossible.
        ::SetErrorMode (SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#    if defined(_MSC_VER)
        ::_set_error_mode (_OUT_TO_STDERR);
        _CrtSetReportMode (_CRT_WARN, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_WARN, _CRTDBG_FILE_STDERR);
        _CrtSetReportMode (_CRT_ERROR, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_ERROR, _CRTDBG_FILE_STDERR);
        _CrtSetReportMode (_CRT_ASSERT, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
        _CrtSetReportFile (_CRT_ASSERT, _CRTDBG_FILE_STDERR);
#    endif
#endif
        return RUN_ALL_TESTS ();
    }